

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = table->ColumnsCount;
  if (0 < iVar2) {
    lVar3 = 100;
    lVar4 = 0;
    do {
      pIVar1 = (table->Columns).Data;
      if ((*(char *)((long)pIVar1 + lVar3 + -10) != '\0') ||
         ((*(byte *)((long)pIVar1 + lVar3 + -100) & 8) != 0)) {
        *(undefined2 *)((long)pIVar1 + lVar3 + -1) = 0x102;
        iVar2 = table->ColumnsCount;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x68;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable* table)
{
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_WidthStretch)) // Cannot reset weight of hidden stretch column
            continue;
        column->CannotSkipItemsQueue = (1 << 0);
        column->AutoFitQueue = (1 << 1);
    }
}